

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1515.c
# Opt level: O0

int do_one_request(CURLM *m,char *URL,char *resolve)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  timeval older_01;
  CURLMcode ec_9;
  int ec_8;
  CURLMcode ec_7;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval timeout;
  CURLMcode ec_6;
  CURLMcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  int msgs_left;
  CURLMsg *msg;
  int res;
  int still_running;
  curl_slist *resolve_list;
  CURL *curls;
  char *resolve_local;
  char *URL_local;
  CURLM *m_local;
  
  _res = 0;
  msg._0_4_ = 0;
  curls = (CURL *)resolve;
  resolve_local = URL;
  URL_local = (char *)m;
  _res = curl_slist_append(0,resolve);
  resolve_list = (curl_slist *)curl_easy_init();
  if (resolve_list == (curl_slist *)0x0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                  ,0x41);
    msg._0_4_ = 0x7c;
  }
  if ((int)msg == 0) {
    iVar2 = curl_easy_setopt(resolve_list,0x2712,resolve_local);
    uVar1 = _stderr;
    if (iVar2 != 0) {
      uVar3 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                    ,0x43,iVar2,uVar3);
      msg._0_4_ = iVar2;
    }
    if ((int)msg == 0) {
      iVar2 = curl_easy_setopt(resolve_list,0x27db,_res);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x44,iVar2,uVar3);
        msg._0_4_ = iVar2;
      }
      if ((int)msg == 0) {
        iVar2 = curl_easy_setopt(resolve_list,0x4e7e,debug_callback);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                        ,0x45,iVar2,uVar3);
          msg._0_4_ = iVar2;
        }
        if ((int)msg == 0) {
          iVar2 = curl_easy_setopt(resolve_list,0x29,1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                          ,0x46,iVar2,uVar3);
            msg._0_4_ = iVar2;
          }
          if ((int)msg == 0) {
            iVar2 = curl_easy_setopt(resolve_list,0x5c,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                            ,0x47,iVar2,uVar3);
              msg._0_4_ = iVar2;
            }
            if ((int)msg == 0) {
              iVar2 = curl_multi_add_handle(URL_local,resolve_list);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                              ,0x49,iVar2,uVar3);
                msg._0_4_ = iVar2;
              }
              if ((int)msg == 0) {
                iVar2 = curl_multi_perform(URL_local,(long)&msg + 4);
                uVar1 = _stderr;
                if (iVar2 == 0) {
                  if (msg._4_4_ < 0) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                  ,0x4a,msg._4_4_);
                    msg._0_4_ = 0x7a;
                  }
                }
                else {
                  uVar3 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                ,0x4a,iVar2,uVar3);
                  msg._0_4_ = iVar2;
                }
                if ((int)msg == 0) {
                  tVar7 = tutil_tvnow();
                  older.tv_usec = tv_test_start.tv_usec;
                  older.tv_sec = tv_test_start.tv_sec;
                  lVar4 = tutil_tvdiff(tVar7,older);
                  if (60000 < lVar4) {
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                  ,0x4c);
                    msg._0_4_ = 0x7d;
                  }
                  while ((int)msg == 0) {
                    if (msg._4_4_ == 0) goto LAB_00102ddb;
                    __arr._4_4_ = -99;
                    for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
                      fdwrite.__fds_bits[(ulong)(uint)__arr + 0xf] = 0;
                    }
                    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1)
                    {
                      fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                    }
                    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1)
                    {
                      (&__i + (ulong)__arr_2._4_4_ * 2)[0] = 0;
                      (&__i + (ulong)__arr_2._4_4_ * 2)[1] = 0;
                    }
                    fdread.__fds_bits[0xf] = 1;
                    iVar2 = curl_multi_fdset(URL_local,fdwrite.__fds_bits + 0xf,
                                             fdexcep.__fds_bits + 0xf,&__i,(long)&__arr + 4);
                    uVar1 = _stderr;
                    if (iVar2 == 0) {
                      if (__arr._4_4_ < -1) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                      ,0x59,__arr._4_4_);
                        msg._0_4_ = 0x7a;
                      }
                    }
                    else {
                      uVar3 = curl_multi_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                    ,0x59,iVar2,uVar3);
                      msg._0_4_ = iVar2;
                    }
                    if ((int)msg != 0) break;
                    iVar2 = select_wrapper(__arr._4_4_ + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                           (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&__i,
                                           (timeval *)(fdread.__fds_bits + 0xf));
                    if (iVar2 == -1) {
                      piVar5 = __errno_location();
                      uVar1 = _stderr;
                      iVar2 = *piVar5;
                      pcVar6 = strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                    ,0x5a,iVar2,pcVar6);
                      msg._0_4_ = 0x79;
                    }
                    if ((int)msg != 0) break;
                    tVar7 = tutil_tvnow();
                    older_00.tv_usec = tv_test_start.tv_usec;
                    older_00.tv_sec = tv_test_start.tv_sec;
                    lVar4 = tutil_tvdiff(tVar7,older_00);
                    if (60000 < lVar4) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                    ,0x5c);
                      msg._0_4_ = 0x7d;
                    }
                    if ((int)msg != 0) break;
                    iVar2 = curl_multi_perform(URL_local,(long)&msg + 4);
                    uVar1 = _stderr;
                    if (iVar2 == 0) {
                      if (msg._4_4_ < 0) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                      ,0x5d,msg._4_4_);
                        msg._0_4_ = 0x7a;
                      }
                    }
                    else {
                      uVar3 = curl_multi_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                    ,0x5d,iVar2,uVar3);
                      msg._0_4_ = iVar2;
                    }
                    if ((int)msg != 0) break;
                    tVar7 = tutil_tvnow();
                    older_01.tv_usec = tv_test_start.tv_usec;
                    older_01.tv_sec = tv_test_start.tv_sec;
                    lVar4 = tutil_tvdiff(tVar7,older_01);
                    if (60000 < lVar4) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                    ,0x5f);
                      msg._0_4_ = 0x7d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_00102e19;
  while ((*_ec != 1 || (*(curl_slist **)(_ec + 2) != resolve_list))) {
LAB_00102ddb:
    _ec = (int *)curl_multi_info_read(URL_local,&ec_1);
    if (_ec == (int *)0x0) goto LAB_00102e19;
  }
  msg._0_4_ = _ec[4];
LAB_00102e19:
  curl_multi_remove_handle(URL_local,resolve_list);
  curl_easy_cleanup(resolve_list);
  curl_slist_free_all(_res);
  return (int)msg;
}

Assistant:

static int do_one_request(CURLM *m, char *URL, char *resolve)
{
  CURL *curls;
  struct curl_slist *resolve_list = NULL;
  int still_running;
  int res = 0;
  CURLMsg *msg;
  int msgs_left;

  resolve_list = curl_slist_append(resolve_list, resolve);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_RESOLVE, resolve_list);
  easy_setopt(curls, CURLOPT_DEBUGFUNCTION, debug_callback);
  easy_setopt(curls, CURLOPT_VERBOSE, 1);
  easy_setopt(curls, CURLOPT_DNS_CACHE_TIMEOUT, DNS_TIMEOUT);

  multi_add_handle(m, curls);
  multi_perform(m, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);
    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
    multi_perform(m, &still_running);

    abort_on_test_timeout();
  }

  while((msg = curl_multi_info_read(m, &msgs_left))) {
    if(msg->msg == CURLMSG_DONE && msg->easy_handle == curls) {
      res = msg->data.result;
      break;
    }
  }

test_cleanup:

  curl_multi_remove_handle(m, curls);
  curl_easy_cleanup(curls);
  curl_slist_free_all(resolve_list);

  return res;
}